

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

pair<bool,_unsigned_long> __thiscall
LiteralTokenizerRule::tryMatch(LiteralTokenizerRule *this,shared_ptr<Readable> *reader)

{
  char cVar1;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  undefined8 in_RAX;
  char *pcVar5;
  undefined4 extraout_var_00;
  undefined7 extraout_var;
  ulong uVar6;
  ulong uVar7;
  pair<bool,_unsigned_long> pVar8;
  
  uVar7 = 0;
  do {
    uVar6 = (this->literal)._M_string_length;
    if (uVar6 <= uVar7) {
      uVar7 = CONCAT71((int7)((ulong)in_RAX >> 8),1);
      if (this->nextCharMustBeNonAlpha == true) {
        peVar2 = (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        iVar4 = (*peVar2->_vptr_Readable[2])(peVar2,uVar6);
        bVar3 = isLiteralRest((char)iVar4);
        if (bVar3) {
          uVar6 = 0;
        }
        else {
          uVar6 = (this->literal)._M_string_length;
        }
        uVar7 = CONCAT71(extraout_var,bVar3) ^ 1;
      }
      goto LAB_00114dfe;
    }
    pcVar5 = (char *)std::__cxx11::string::at((ulong)&this->literal);
    cVar1 = *pcVar5;
    peVar2 = (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar4 = (*peVar2->_vptr_Readable[2])(peVar2,uVar7);
    in_RAX = CONCAT44(extraout_var_00,iVar4);
    uVar7 = uVar7 + 1;
  } while (cVar1 == (char)iVar4);
  uVar7 = 0;
  uVar6 = 0;
LAB_00114dfe:
  pVar8.second = uVar6;
  pVar8._0_8_ = uVar7;
  return pVar8;
}

Assistant:

std::pair<bool, std::size_t> tryMatch(std::shared_ptr<Readable> reader) noexcept override {
    for (std::size_t i = 0; i < this->literal.length(); i++) {
      if (this->literal.at(i) != reader->charAt(i)) {
        return std::make_pair(false, 0);
      }
    }

    if (this->nextCharMustBeNonAlpha && isLiteralRest(reader->charAt(this->literal.size()))) {
      return std::make_pair(false, 0);
    }

    return std::make_pair(true, this->literal.length());
  }